

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_set_max_window(ebur128_state *st,unsigned_long window)

{
  int iVar1;
  void *pvVar2;
  double *new_audio_data;
  size_t new_audio_data_size;
  size_t new_audio_data_frames;
  size_t j;
  unsigned_long uStack_20;
  int errcode;
  unsigned_long window_local;
  ebur128_state *st_local;
  
  j._4_4_ = 0;
  if (((st->mode & 3U) == 3) && (window < 3000)) {
    uStack_20 = 3000;
  }
  else {
    uStack_20 = window;
    if (((st->mode & 1U) == 1) && (window < 400)) {
      uStack_20 = 400;
    }
  }
  if (uStack_20 == st->d->window) {
    st_local._4_4_ = 4;
  }
  else {
    window_local = (unsigned_long)st;
    iVar1 = safe_size_mul(st->samplerate,uStack_20,&new_audio_data_size);
    if ((iVar1 == 0) &&
       (new_audio_data_size <= -*(long *)(*(long *)(window_local + 0x10) + 0x28) - 1U)) {
      if (new_audio_data_size % *(ulong *)(*(long *)(window_local + 0x10) + 0x28) != 0) {
        new_audio_data_size =
             (new_audio_data_size + *(long *)(*(long *)(window_local + 0x10) + 0x28)) -
             new_audio_data_size % *(ulong *)(*(long *)(window_local + 0x10) + 0x28);
      }
      iVar1 = safe_size_mul(new_audio_data_size,(ulong)*(uint *)(window_local + 4) << 3,
                            (size_t *)&new_audio_data);
      if (iVar1 == 0) {
        pvVar2 = malloc((size_t)new_audio_data);
        if (pvVar2 == (void *)0x0) {
          j._4_4_ = 1;
        }
        else {
          *(unsigned_long *)(*(long *)(window_local + 0x10) + 0x130) = uStack_20;
          free((void *)**(undefined8 **)(window_local + 0x10));
          **(undefined8 **)(window_local + 0x10) = pvVar2;
          *(size_t *)(*(long *)(window_local + 0x10) + 8) = new_audio_data_size;
          for (new_audio_data_frames = 0;
              new_audio_data_frames <
              *(long *)(*(long *)(window_local + 0x10) + 8) * (ulong)*(uint *)(window_local + 4);
              new_audio_data_frames = new_audio_data_frames + 1) {
            *(undefined8 *)(**(long **)(window_local + 0x10) + new_audio_data_frames * 8) = 0;
          }
          *(long *)(*(long *)(window_local + 0x10) + 0x18) =
               *(long *)(*(long *)(window_local + 0x10) + 0x28) << 2;
          *(undefined8 *)(*(long *)(window_local + 0x10) + 0x10) = 0;
          *(undefined8 *)(*(long *)(window_local + 0x10) + 0xe0) = 0;
        }
        st_local._4_4_ = j._4_4_;
      }
      else {
        st_local._4_4_ = 1;
      }
    }
    else {
      st_local._4_4_ = 1;
    }
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_set_max_window(ebur128_state* st, unsigned long window) {
  int errcode = EBUR128_SUCCESS;
  size_t j;

  if ((st->mode & EBUR128_MODE_S) == EBUR128_MODE_S && window < 3000) {
    window = 3000;
  } else if ((st->mode & EBUR128_MODE_M) == EBUR128_MODE_M && window < 400) {
    window = 400;
  }

  if (window == st->d->window) {
    return EBUR128_ERROR_NO_CHANGE;
  }

  size_t new_audio_data_frames;
  if (safe_size_mul(st->samplerate, window, &new_audio_data_frames) != 0 ||
      new_audio_data_frames > ((size_t) -1) - st->d->samples_in_100ms) {
    return EBUR128_ERROR_NOMEM;
  }
  if (new_audio_data_frames % st->d->samples_in_100ms) {
    /* round up to multiple of samples_in_100ms */
    new_audio_data_frames = (new_audio_data_frames + st->d->samples_in_100ms) -
                            (new_audio_data_frames % st->d->samples_in_100ms);
  }

  size_t new_audio_data_size;
  if (safe_size_mul(new_audio_data_frames, st->channels * sizeof(double),
                    &new_audio_data_size) != 0) {
    return EBUR128_ERROR_NOMEM;
  }

  double* new_audio_data = (double*) malloc(new_audio_data_size);
  CHECK_ERROR(!new_audio_data, EBUR128_ERROR_NOMEM, exit)

  st->d->window = window;
  free(st->d->audio_data);
  st->d->audio_data = new_audio_data;
  st->d->audio_data_frames = new_audio_data_frames;
  for (j = 0; j < st->d->audio_data_frames * st->channels; ++j) {
    st->d->audio_data[j] = 0.0;
  }

  /* the first block needs 400ms of audio data */
  st->d->needed_frames = st->d->samples_in_100ms * 4;
  /* start at the beginning of the buffer */
  st->d->audio_data_index = 0;
  /* reset short term frame counter */
  st->d->short_term_frame_counter = 0;

exit:
  return errcode;
}